

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

SysView ** __thiscall
r_code::vector<r_code::SysView_*>::operator[](vector<r_code::SysView_*> *this,size_t i)

{
  reference ppSVar1;
  
  if ((ulong)(*(long *)(this + 8) - *(long *)this >> 3) <= i) {
    std::vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>::resize
              ((vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_> *)this,i + 1);
  }
  ppSVar1 = std::vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_>::at
                      ((vector<r_code::SysView_*,_std::allocator<r_code::SysView_*>_> *)this,i);
  return ppSVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }